

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fOcclusionQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::OcclusionQueryTests::init(OcclusionQueryTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  OcclusionQueryCase *pOVar1;
  
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"scissor","scissor",1,10,1.6,1,1,0.3,
             0x8c2f,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"depth_write","depth_write",8,10,1.6,1,7,
             0.3,0x8c2f,2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"depth_clear","depth_clear",5,10,1.6,1,5,
             0.2,0x8c2f,4);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"stencil_write","stencil_write",8,10,2.0,1
             ,5,0.4,0x8c2f,8);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"stencil_clear","stencil_clear",5,10,2.0,1
             ,3,0.3,0x8c2f,0x10);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"scissor_depth_write",
             "scissor_depth_write",5,10,1.6,2,5,0.3,0x8c2f,3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"scissor_depth_clear",
             "scissor_depth_clear",7,10,1.6,2,5,1.0,0x8c2f,5);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"scissor_stencil_write",
             "scissor_stencil_write",4,10,1.6,2,5,0.3,0x8c2f,9);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"scissor_stencil_clear",
             "scissor_stencil_clear",4,10,1.6,2,5,1.0,0x8c2f,0x11);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"depth_write_depth_clear",
             "depth_write_depth_clear",7,10,1.6,1,5,0.2,0x8c2f,6);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"depth_write_stencil_write",
             "depth_write_stencil_write",8,10,1.6,1,5,0.3,0x8c2f,10);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"depth_write_stencil_clear",
             "depth_write_stencil_clear",8,10,1.6,1,5,0.3,0x8c2f,0x12);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"depth_clear_stencil_write",
             "depth_clear_stencil_write",8,10,1.6,1,5,0.3,0x8c2f,0xc);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"depth_clear_stencil_clear",
             "depth_clear_stencil_clear",0xc,10,1.6,1,5,0.2,0x8c2f,0x14);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"stencil_write_stencil_clear",
             "stencil_write_stencil_clear",5,10,2.0,1,5,0.4,0x8c2f,0x18);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"scissor_depth_write_depth_clear",
             "scissor_depth_write_depth_clear",5,10,1.6,2,5,0.4,0x8c2f,7);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"scissor_depth_write_stencil_write",
             "scissor_depth_write_stencil_write",4,10,1.6,2,5,0.4,0x8c2f,0xb);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"scissor_depth_write_stencil_clear",
             "scissor_depth_write_stencil_clear",6,10,1.6,2,5,0.4,0x8c2f,0x13);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"scissor_depth_clear_stencil_write",
             "scissor_depth_clear_stencil_write",4,10,1.6,2,5,0.4,0x8c2f,0xd);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"scissor_depth_clear_stencil_clear",
             "scissor_depth_clear_stencil_clear",5,10,1.6,2,5,0.4,0x8c2f,0x15);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"scissor_stencil_write_stencil_clear",
             "scissor_stencil_write_stencil_clear",4,10,1.6,2,5,0.4,0x8c2f,0x19);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"depth_write_depth_clear_stencil_write",
             "depth_write_depth_clear_stencil_write",7,10,1.6,2,5,0.4,0x8c2f,0xe);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"depth_write_depth_clear_stencil_clear",
             "depth_write_depth_clear_stencil_clear",7,10,1.6,2,5,0.4,0x8c2f,0x16);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"depth_write_stencil_write_stencil_clear",
             "depth_write_stencil_write_stencil_clear",7,10,1.6,2,5,0.4,0x8c2f,0x1a);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"depth_clear_stencil_write_stencil_clear",
             "depth_clear_stencil_write_stencil_clear",7,10,1.6,2,5,0.4,0x8c2f,0x1c);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "scissor_depth_write_depth_clear_stencil_write",
             "scissor_depth_write_depth_clear_stencil_write",4,10,1.6,2,5,0.4,0x8c2f,0xf);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "scissor_depth_write_depth_clear_stencil_clear",
             "scissor_depth_write_depth_clear_stencil_clear",4,10,1.6,2,5,0.4,0x8c2f,0x17);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "scissor_depth_write_stencil_write_stencil_clear",
             "scissor_depth_write_stencil_write_stencil_clear",5,10,1.6,2,5,0.4,0x8c2f,0x1b);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "scissor_depth_clear_stencil_write_stencil_clear",
             "scissor_depth_clear_stencil_write_stencil_clear",4,10,1.6,2,5,0.4,0x8c2f,0x1d);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "depth_write_depth_clear_stencil_write_stencil_clear",
             "depth_write_depth_clear_stencil_write_stencil_clear",7,10,1.6,2,5,0.4,0x8c2f,0x1e);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"all_occluders","all_occluders",7,10,1.6,3
             ,5,0.6,0x8c2f,0x1f);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"conservative_scissor",
             "conservative_scissor",1,10,1.6,1,1,0.3,0x8d6a,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"conservative_depth_write",
             "conservative_depth_write",8,10,1.6,1,7,0.3,0x8d6a,2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"conservative_depth_clear",
             "conservative_depth_clear",5,10,1.6,1,5,0.2,0x8d6a,4);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"conservative_stencil_write",
             "conservative_stencil_write",8,10,2.0,1,5,0.4,0x8d6a,8);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"conservative_stencil_clear",
             "conservative_stencil_clear",5,10,2.0,1,3,0.3,0x8d6a,0x10);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"conservative_scissor_depth_write",
             "conservative_scissor_depth_write",5,10,1.6,2,5,0.3,0x8d6a,3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"conservative_scissor_depth_clear",
             "conservative_scissor_depth_clear",7,10,1.6,2,5,1.0,0x8d6a,5);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"conservative_scissor_stencil_write",
             "conservative_scissor_stencil_write",4,10,1.6,2,5,0.3,0x8d6a,9);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"conservative_scissor_stencil_clear",
             "conservative_scissor_stencil_clear",4,10,1.6,2,5,1.0,0x8d6a,0x11);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"conservative_depth_write_depth_clear",
             "conservative_depth_write_depth_clear",7,10,1.6,1,5,0.2,0x8d6a,6);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"conservative_depth_write_stencil_write",
             "conservative_depth_write_stencil_write",8,10,1.6,1,5,0.3,0x8d6a,10);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"conservative_depth_write_stencil_clear",
             "conservative_depth_write_stencil_clear",8,10,1.6,1,5,0.3,0x8d6a,0x12);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"conservative_depth_clear_stencil_write",
             "conservative_depth_clear_stencil_write",8,10,1.6,1,5,0.3,0x8d6a,0xc);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"conservative_depth_clear_stencil_clear",
             "conservative_depth_clear_stencil_clear",0xc,10,1.6,1,5,0.2,0x8d6a,0x14);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"conservative_stencil_write_stencil_clear"
             ,"conservative_stencil_write_stencil_clear",5,10,2.0,1,5,0.4,0x8d6a,0x18);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "conservative_scissor_depth_write_depth_clear",
             "conservative_scissor_depth_write_depth_clear",5,10,1.6,2,5,0.4,0x8d6a,7);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "conservative_scissor_depth_write_stencil_write",
             "conservative_scissor_depth_write_stencil_write",4,10,1.6,2,5,0.4,0x8d6a,0xb);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "conservative_scissor_depth_write_stencil_clear",
             "conservative_scissor_depth_write_stencil_clear",6,10,1.6,2,5,0.4,0x8d6a,0x13);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "conservative_scissor_depth_clear_stencil_write",
             "conservative_scissor_depth_clear_stencil_write",4,10,1.6,2,5,0.4,0x8d6a,0xd);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "conservative_scissor_depth_clear_stencil_clear",
             "conservative_scissor_depth_clear_stencil_clear",5,10,1.6,2,5,0.4,0x8d6a,0x15);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "conservative_scissor_stencil_write_stencil_clear",
             "conservative_scissor_stencil_write_stencil_clear",4,10,1.6,2,5,0.4,0x8d6a,0x19);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "conservative_depth_write_depth_clear_stencil_write",
             "conservative_depth_write_depth_clear_stencil_write",7,10,1.6,2,5,0.4,0x8d6a,0xe);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "conservative_depth_write_depth_clear_stencil_clear",
             "conservative_depth_write_depth_clear_stencil_clear",7,10,1.6,2,5,0.4,0x8d6a,0x16);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "conservative_depth_write_stencil_write_stencil_clear",
             "conservative_depth_write_stencil_write_stencil_clear",7,10,1.6,2,5,0.4,0x8d6a,0x1a);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "conservative_depth_clear_stencil_write_stencil_clear",
             "conservative_depth_clear_stencil_write_stencil_clear",7,10,1.6,2,5,0.4,0x8d6a,0x1c);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "conservative_scissor_depth_write_depth_clear_stencil_write",
             "conservative_scissor_depth_write_depth_clear_stencil_write",4,10,1.6,2,5,0.4,0x8d6a,
             0xf);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "conservative_scissor_depth_write_depth_clear_stencil_clear",
             "conservative_scissor_depth_write_depth_clear_stencil_clear",4,10,1.6,2,5,0.4,0x8d6a,
             0x17);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "conservative_scissor_depth_write_stencil_write_stencil_clear",
             "conservative_scissor_depth_write_stencil_write_stencil_clear",5,10,1.6,2,5,0.4,0x8d6a,
             0x1b);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "conservative_scissor_depth_clear_stencil_write_stencil_clear",
             "conservative_scissor_depth_clear_stencil_write_stencil_clear",4,10,1.6,2,5,0.4,0x8d6a,
             0x1d);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,
             "conservative_depth_write_depth_clear_stencil_write_stencil_clear",
             "conservative_depth_write_depth_clear_stencil_write_stencil_clear",7,10,1.6,2,5,0.4,
             0x8d6a,0x1e);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  pOVar1 = (OcclusionQueryCase *)operator_new(0xc0);
  OcclusionQueryCase::OcclusionQueryCase
            (pOVar1,(this->super_TestCaseGroup).m_context,"conservative_all_occluders",
             "conservative_all_occluders",7,10,1.6,3,5,0.6,0x8d6a,0x1f);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pOVar1);
  return extraout_EAX;
}

Assistant:

void OcclusionQueryTests::init (void)
{
	// Strict occlusion query cases

	addChild(new OcclusionQueryCase(m_context, "scissor",												"scissor",												1,	10, 1.6f, 1, 1, 0.3f, GL_ANY_SAMPLES_PASSED, OCCLUDER_SCISSOR));
	addChild(new OcclusionQueryCase(m_context, "depth_write",											"depth_write",											8,	10, 1.6f, 1, 7, 0.3f, GL_ANY_SAMPLES_PASSED, OCCLUDER_DEPTH_WRITE));
	addChild(new OcclusionQueryCase(m_context, "depth_clear",											"depth_clear",											5,	10, 1.6f, 1, 5, 0.2f, GL_ANY_SAMPLES_PASSED, OCCLUDER_DEPTH_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "stencil_write",											"stencil_write",										8,	10, 2.0f, 1, 5, 0.4f, GL_ANY_SAMPLES_PASSED, OCCLUDER_STENCIL_WRITE));
	addChild(new OcclusionQueryCase(m_context, "stencil_clear",											"stencil_clear",										5,	10, 2.0f, 1, 3, 0.3f, GL_ANY_SAMPLES_PASSED, OCCLUDER_STENCIL_CLEAR));

	addChild(new OcclusionQueryCase(m_context, "scissor_depth_write",									"scissor_depth_write",									5,	10, 1.6f, 2, 5, 0.3f, GL_ANY_SAMPLES_PASSED, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_WRITE));
	addChild(new OcclusionQueryCase(m_context, "scissor_depth_clear",									"scissor_depth_clear",									7,	10, 1.6f, 2, 5, 1.0f, GL_ANY_SAMPLES_PASSED, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "scissor_stencil_write",									"scissor_stencil_write",								4,	10, 1.6f, 2, 5, 0.3f, GL_ANY_SAMPLES_PASSED, OCCLUDER_SCISSOR | OCCLUDER_STENCIL_WRITE));
	addChild(new OcclusionQueryCase(m_context, "scissor_stencil_clear",									"scissor_stencil_clear",								4,	10, 1.6f, 2, 5, 1.0f, GL_ANY_SAMPLES_PASSED, OCCLUDER_SCISSOR | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "depth_write_depth_clear",								"depth_write_depth_clear",								7,	10, 1.6f, 1, 5, 0.2f, GL_ANY_SAMPLES_PASSED, OCCLUDER_DEPTH_WRITE | OCCLUDER_DEPTH_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "depth_write_stencil_write",								"depth_write_stencil_write",							8,	10, 1.6f, 1, 5, 0.3f, GL_ANY_SAMPLES_PASSED, OCCLUDER_DEPTH_WRITE | OCCLUDER_STENCIL_WRITE));
	addChild(new OcclusionQueryCase(m_context, "depth_write_stencil_clear",								"depth_write_stencil_clear",							8,	10, 1.6f, 1, 5, 0.3f, GL_ANY_SAMPLES_PASSED, OCCLUDER_DEPTH_WRITE | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "depth_clear_stencil_write",								"depth_clear_stencil_write",							8,	10, 1.6f, 1, 5, 0.3f, GL_ANY_SAMPLES_PASSED, OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_WRITE));
	addChild(new OcclusionQueryCase(m_context, "depth_clear_stencil_clear",								"depth_clear_stencil_clear",							12,	10, 1.6f, 1, 5, 0.2f, GL_ANY_SAMPLES_PASSED, OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "stencil_write_stencil_clear",							"stencil_write_stencil_clear",							5,	10, 2.0f, 1, 5, 0.4f, GL_ANY_SAMPLES_PASSED, OCCLUDER_STENCIL_WRITE | OCCLUDER_STENCIL_CLEAR));

	addChild(new OcclusionQueryCase(m_context, "scissor_depth_write_depth_clear",						"scissor_depth_write_depth_clear",						5,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_WRITE | OCCLUDER_DEPTH_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "scissor_depth_write_stencil_write",						"scissor_depth_write_stencil_write",					4,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_WRITE | OCCLUDER_STENCIL_WRITE));
	addChild(new OcclusionQueryCase(m_context, "scissor_depth_write_stencil_clear",						"scissor_depth_write_stencil_clear",					6,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_WRITE | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "scissor_depth_clear_stencil_write",						"scissor_depth_clear_stencil_write",					4,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_WRITE));
	addChild(new OcclusionQueryCase(m_context, "scissor_depth_clear_stencil_clear",						"scissor_depth_clear_stencil_clear",					5,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "scissor_stencil_write_stencil_clear",					"scissor_stencil_write_stencil_clear",					4,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED, OCCLUDER_SCISSOR | OCCLUDER_STENCIL_WRITE | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "depth_write_depth_clear_stencil_write",					"depth_write_depth_clear_stencil_write",				7,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED, OCCLUDER_DEPTH_WRITE | OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_WRITE));
	addChild(new OcclusionQueryCase(m_context, "depth_write_depth_clear_stencil_clear",					"depth_write_depth_clear_stencil_clear",				7,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED, OCCLUDER_DEPTH_WRITE | OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "depth_write_stencil_write_stencil_clear",				"depth_write_stencil_write_stencil_clear",				7,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED, OCCLUDER_DEPTH_WRITE | OCCLUDER_STENCIL_WRITE | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "depth_clear_stencil_write_stencil_clear",				"depth_clear_stencil_write_stencil_clear",				7,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED, OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_WRITE | OCCLUDER_STENCIL_CLEAR));

	addChild(new OcclusionQueryCase(m_context, "scissor_depth_write_depth_clear_stencil_write",			"scissor_depth_write_depth_clear_stencil_write",		4,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_WRITE | OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_WRITE));
	addChild(new OcclusionQueryCase(m_context, "scissor_depth_write_depth_clear_stencil_clear",			"scissor_depth_write_depth_clear_stencil_clear",		4,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_WRITE | OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "scissor_depth_write_stencil_write_stencil_clear",		"scissor_depth_write_stencil_write_stencil_clear",		5,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_WRITE | OCCLUDER_STENCIL_WRITE | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "scissor_depth_clear_stencil_write_stencil_clear",		"scissor_depth_clear_stencil_write_stencil_clear",		4,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_WRITE | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "depth_write_depth_clear_stencil_write_stencil_clear",	"depth_write_depth_clear_stencil_write_stencil_clear",	7,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED, OCCLUDER_DEPTH_WRITE | OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_WRITE | OCCLUDER_STENCIL_CLEAR));

	addChild(new OcclusionQueryCase(m_context, "all_occluders",											"all_occluders",										7,	10, 1.6f, 3, 5, 0.6f, GL_ANY_SAMPLES_PASSED, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_WRITE | OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_WRITE | OCCLUDER_STENCIL_CLEAR));

	// Conservative occlusion query cases

	addChild(new OcclusionQueryCase(m_context, "conservative_scissor",												"conservative_scissor",												1,	10, 1.6f, 1, 1, 0.3f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_SCISSOR));
	addChild(new OcclusionQueryCase(m_context, "conservative_depth_write",											"conservative_depth_write",											8,	10, 1.6f, 1, 7, 0.3f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_DEPTH_WRITE));
	addChild(new OcclusionQueryCase(m_context, "conservative_depth_clear",											"conservative_depth_clear",											5,	10, 1.6f, 1, 5, 0.2f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_DEPTH_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "conservative_stencil_write",										"conservative_stencil_write",										8,	10, 2.0f, 1, 5, 0.4f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_STENCIL_WRITE));
	addChild(new OcclusionQueryCase(m_context, "conservative_stencil_clear",										"conservative_stencil_clear",										5,	10, 2.0f, 1, 3, 0.3f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_STENCIL_CLEAR));

	addChild(new OcclusionQueryCase(m_context, "conservative_scissor_depth_write",									"conservative_scissor_depth_write",									5,	10, 1.6f, 2, 5, 0.3f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_WRITE));
	addChild(new OcclusionQueryCase(m_context, "conservative_scissor_depth_clear",									"conservative_scissor_depth_clear",									7,	10, 1.6f, 2, 5, 1.0f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "conservative_scissor_stencil_write",								"conservative_scissor_stencil_write",								4,	10, 1.6f, 2, 5, 0.3f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_SCISSOR | OCCLUDER_STENCIL_WRITE));
	addChild(new OcclusionQueryCase(m_context, "conservative_scissor_stencil_clear",								"conservative_scissor_stencil_clear",								4,	10, 1.6f, 2, 5, 1.0f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_SCISSOR | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "conservative_depth_write_depth_clear",								"conservative_depth_write_depth_clear",								7,	10, 1.6f, 1, 5, 0.2f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_DEPTH_WRITE | OCCLUDER_DEPTH_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "conservative_depth_write_stencil_write",							"conservative_depth_write_stencil_write",							8,	10, 1.6f, 1, 5, 0.3f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_DEPTH_WRITE | OCCLUDER_STENCIL_WRITE));
	addChild(new OcclusionQueryCase(m_context, "conservative_depth_write_stencil_clear",							"conservative_depth_write_stencil_clear",							8,	10, 1.6f, 1, 5, 0.3f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_DEPTH_WRITE | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "conservative_depth_clear_stencil_write",							"conservative_depth_clear_stencil_write",							8,	10, 1.6f, 1, 5, 0.3f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_WRITE));
	addChild(new OcclusionQueryCase(m_context, "conservative_depth_clear_stencil_clear",							"conservative_depth_clear_stencil_clear",							12,	10, 1.6f, 1, 5, 0.2f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "conservative_stencil_write_stencil_clear",							"conservative_stencil_write_stencil_clear",							5,	10, 2.0f, 1, 5, 0.4f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_STENCIL_WRITE | OCCLUDER_STENCIL_CLEAR));

	addChild(new OcclusionQueryCase(m_context, "conservative_scissor_depth_write_depth_clear",						"conservative_scissor_depth_write_depth_clear",						5,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_WRITE | OCCLUDER_DEPTH_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "conservative_scissor_depth_write_stencil_write",					"conservative_scissor_depth_write_stencil_write",					4,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_WRITE | OCCLUDER_STENCIL_WRITE));
	addChild(new OcclusionQueryCase(m_context, "conservative_scissor_depth_write_stencil_clear",					"conservative_scissor_depth_write_stencil_clear",					6,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_WRITE | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "conservative_scissor_depth_clear_stencil_write",					"conservative_scissor_depth_clear_stencil_write",					4,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_WRITE));
	addChild(new OcclusionQueryCase(m_context, "conservative_scissor_depth_clear_stencil_clear",					"conservative_scissor_depth_clear_stencil_clear",					5,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "conservative_scissor_stencil_write_stencil_clear",					"conservative_scissor_stencil_write_stencil_clear",					4,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_SCISSOR | OCCLUDER_STENCIL_WRITE | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "conservative_depth_write_depth_clear_stencil_write",				"conservative_depth_write_depth_clear_stencil_write",				7,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_DEPTH_WRITE | OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_WRITE));
	addChild(new OcclusionQueryCase(m_context, "conservative_depth_write_depth_clear_stencil_clear",				"conservative_depth_write_depth_clear_stencil_clear",				7,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_DEPTH_WRITE | OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "conservative_depth_write_stencil_write_stencil_clear",				"conservative_depth_write_stencil_write_stencil_clear",				7,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_DEPTH_WRITE | OCCLUDER_STENCIL_WRITE | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "conservative_depth_clear_stencil_write_stencil_clear",				"conservative_depth_clear_stencil_write_stencil_clear",				7,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_WRITE | OCCLUDER_STENCIL_CLEAR));

	addChild(new OcclusionQueryCase(m_context, "conservative_scissor_depth_write_depth_clear_stencil_write",		"conservative_scissor_depth_write_depth_clear_stencil_write",		4,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_WRITE | OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_WRITE));
	addChild(new OcclusionQueryCase(m_context, "conservative_scissor_depth_write_depth_clear_stencil_clear",		"conservative_scissor_depth_write_depth_clear_stencil_clear",		4,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_WRITE | OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "conservative_scissor_depth_write_stencil_write_stencil_clear",		"conservative_scissor_depth_write_stencil_write_stencil_clear",		5,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_WRITE | OCCLUDER_STENCIL_WRITE | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "conservative_scissor_depth_clear_stencil_write_stencil_clear",		"conservative_scissor_depth_clear_stencil_write_stencil_clear",		4,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_WRITE | OCCLUDER_STENCIL_CLEAR));
	addChild(new OcclusionQueryCase(m_context, "conservative_depth_write_depth_clear_stencil_write_stencil_clear",	"conservative_depth_write_depth_clear_stencil_write_stencil_clear",	7,	10, 1.6f, 2, 5, 0.4f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_DEPTH_WRITE | OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_WRITE | OCCLUDER_STENCIL_CLEAR));

	addChild(new OcclusionQueryCase(m_context, "conservative_all_occluders",										"conservative_all_occluders",										7,	10, 1.6f, 3, 5, 0.6f, GL_ANY_SAMPLES_PASSED_CONSERVATIVE, OCCLUDER_SCISSOR | OCCLUDER_DEPTH_WRITE | OCCLUDER_DEPTH_CLEAR | OCCLUDER_STENCIL_WRITE | OCCLUDER_STENCIL_CLEAR));
}